

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O1

QSize __thiscall
QDockWidgetLayout::sizeFromContent(QDockWidgetLayout *this,QSize *content,bool floating)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Representation RVar5;
  QWidget *this_00;
  QStyle *pQVar6;
  QSize QVar7;
  QSize QVar8;
  Representation RVar9;
  int iVar10;
  ushort uVar11;
  ushort uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  bool bVar17;
  QMargins QVar18;
  int local_40;
  
  local_40 = (content->ht).m_i;
  if ((this->super_QLayout).super_QLayoutItem.field_0xc == '\x01') {
    iVar3 = minimumTitleWidth(this);
    if (local_40 < iVar3) {
      local_40 = iVar3;
    }
    iVar3 = (content->wd).m_i;
    iVar10 = 0;
    if (0 < iVar3) {
      iVar10 = iVar3;
    }
  }
  else {
    if (local_40 < 1) {
      local_40 = 0;
    }
    iVar3 = (content->wd).m_i;
    iVar10 = minimumTitleWidth(this);
    if (iVar10 < iVar3) {
      iVar10 = iVar3;
    }
  }
  QLayout::parentWidget(&this->super_QLayout);
  this_00 = (QWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
  bVar2 = wmSupportsNativeWindowDeco();
  iVar3 = 0;
  bVar17 = false;
  if (bVar2 && floating) {
    bVar17 = (this->item_list).d.ptr[3] == (QLayoutItem *)0x0;
  }
  if (floating && !bVar17) {
    pQVar6 = QWidget::style(this_00);
    iVar3 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x12,0,this_00);
    iVar3 = iVar3 * 2;
  }
  iVar4 = titleHeight(this);
  if (!bVar17) {
    iVar10 = iVar10 + iVar3;
    if ((this->super_QLayout).super_QLayoutItem.field_0xc == '\x01') {
      iVar10 = iVar10 + iVar4;
      local_40 = local_40 + iVar3;
    }
    else {
      local_40 = iVar3 + local_40 + iVar4;
    }
  }
  iVar3 = (content->wd).m_i;
  iVar4 = (content->ht).m_i;
  QVar18 = QWidget::contentsMargins(this_00);
  QVar7 = QWidget::minimumSize(this_00);
  QVar8 = QWidget::maximumSize(this_00);
  lVar1 = *(long *)(*(long *)&this_00->field_0x8 + 0x78);
  uVar12 = 0;
  uVar11 = 0;
  if (lVar1 != 0) {
    uVar12 = *(ushort *)(lVar1 + 0x7c);
    uVar11 = uVar12 >> 2;
  }
  iVar14 = QVar18.m_left.m_i.m_i + QVar18.m_right.m_i.m_i;
  RVar9.m_i = QVar8.wd.m_i.m_i - iVar14;
  iVar15 = QVar18.m_top.m_i.m_i + QVar18.m_bottom.m_i.m_i;
  if (0xfffffe < local_40) {
    local_40 = 0xffffff;
  }
  if (iVar4 < 0) {
    local_40 = -1;
  }
  if (0xfffffe < iVar10) {
    iVar10 = 0xffffff;
  }
  if (iVar3 < 0) {
    iVar10 = -1;
  }
  uVar16 = QVar7.wd.m_i.m_i - iVar14;
  if (uVar16 == 0) {
    uVar16 = 0xffffffff;
  }
  uVar16 = -(uint)((uVar12 & 1) == 0) | uVar16;
  uVar13 = QVar7.ht.m_i.m_i - iVar15;
  if (uVar13 == 0) {
    uVar13 = 0xffffffff;
  }
  uVar13 = -(uint)((uVar12 & 2) == 0) | uVar13;
  if ((uVar11 & 1) == 0) {
    RVar9.m_i = 0xffffff;
  }
  RVar5.m_i = QVar8.ht.m_i.m_i - iVar15;
  if ((uVar11 & 2) == 0) {
    RVar5.m_i = 0xffffff;
  }
  if (iVar10 < RVar9.m_i) {
    RVar9.m_i = iVar10;
  }
  if (local_40 < RVar5.m_i) {
    RVar5.m_i = local_40;
  }
  if (RVar9.m_i <= (int)uVar16) {
    RVar9.m_i = uVar16;
  }
  if (RVar5.m_i <= (int)uVar13) {
    RVar5.m_i = uVar13;
  }
  QVar7.ht.m_i = RVar5.m_i;
  QVar7.wd.m_i = RVar9.m_i;
  return QVar7;
}

Assistant:

QSize QDockWidgetLayout::sizeFromContent(const QSize &content, bool floating) const
{
    QSize result = content;

    if (verticalTitleBar) {
        result.setHeight(qMax(result.height(), minimumTitleWidth()));
        result.setWidth(qMax(content.width(), 0));
    } else {
        result.setHeight(qMax(result.height(), 0));
        result.setWidth(qMax(content.width(), minimumTitleWidth()));
    }

    QDockWidget *w = qobject_cast<QDockWidget*>(parentWidget());
    const bool nativeDeco = nativeWindowDeco(floating);

    int fw = floating && !nativeDeco
            ? w->style()->pixelMetric(QStyle::PM_DockWidgetFrameWidth, nullptr, w)
            : 0;

    const int th = titleHeight();
    if (!nativeDeco) {
        if (verticalTitleBar)
            result += QSize(th + 2*fw, 2*fw);
        else
            result += QSize(2*fw, th + 2*fw);
    }

    result.setHeight(qMin(result.height(), (int) QWIDGETSIZE_MAX));
    result.setWidth(qMin(result.width(), (int) QWIDGETSIZE_MAX));

    if (content.width() < 0)
        result.setWidth(-1);
    if (content.height() < 0)
        result.setHeight(-1);

    const QMargins margins = w->contentsMargins();
    //we need to subtract the contents margin (it will be added by the caller)
    QSize min = w->minimumSize().shrunkBy(margins);
    QSize max = w->maximumSize().shrunkBy(margins);

    /* A floating dockwidget will automatically get its minimumSize set to the layout's
       minimum size + deco. We're *not* interested in this, we only take minimumSize()
       into account if the user set it herself. Otherwise we end up expanding the result
       of a calculation for a non-floating dock widget to a floating dock widget's
       minimum size + window decorations. */

    uint explicitMin = 0;
    uint explicitMax = 0;
    if (w->d_func()->extra != nullptr) {
        explicitMin = w->d_func()->extra->explicitMinSize;
        explicitMax = w->d_func()->extra->explicitMaxSize;
    }

    if (!(explicitMin & Qt::Horizontal) || min.width() == 0)
        min.setWidth(-1);
    if (!(explicitMin & Qt::Vertical) || min.height() == 0)
        min.setHeight(-1);

    if (!(explicitMax & Qt::Horizontal))
        max.setWidth(QWIDGETSIZE_MAX);
    if (!(explicitMax & Qt::Vertical))
        max.setHeight(QWIDGETSIZE_MAX);

    return result.boundedTo(max).expandedTo(min);
}